

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O0

GLenum Diligent::GetFramebufferAttachmentPoint(TEXTURE_FORMAT Format)

{
  TextureFormatAttribs *pTVar1;
  TextureFormatAttribs *FmtAttribs;
  TEXTURE_FORMAT Format_local;
  
  pTVar1 = GetTextureFormatAttribs(Format);
  if (pTVar1->ComponentType == COMPONENT_TYPE_DEPTH) {
    FmtAttribs._4_4_ = 0x8d00;
  }
  else if (pTVar1->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
    FmtAttribs._4_4_ = 0x821a;
  }
  else {
    FmtAttribs._4_4_ = 0x8ce0;
  }
  return FmtAttribs._4_4_;
}

Assistant:

inline GLenum GetFramebufferAttachmentPoint(TEXTURE_FORMAT Format)
{
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Format);
    switch (FmtAttribs.ComponentType)
    {
        case COMPONENT_TYPE_DEPTH:
            return GL_DEPTH_ATTACHMENT;
        case COMPONENT_TYPE_DEPTH_STENCIL:
            return GL_DEPTH_STENCIL_ATTACHMENT;
        default:
            return GL_COLOR_ATTACHMENT0;
    }
}